

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

bool __thiscall sf::Shader::loadFromFile(Shader *this,string *filename,Type type)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> shader;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_268115::getFileContents
                    (filename,(vector<char,_std::allocator<char>_> *)&local_38);
  if (bVar1) {
    if (type == Geometry) {
      bVar1 = compile(this,(char *)0x0,local_38._M_impl.super__Vector_impl_data._M_start,(char *)0x0
                     );
    }
    else if (type == Vertex) {
      bVar1 = compile(this,local_38._M_impl.super__Vector_impl_data._M_start,(char *)0x0,(char *)0x0
                     );
    }
    else {
      bVar1 = compile(this,(char *)0x0,(char *)0x0,local_38._M_impl.super__Vector_impl_data._M_start
                     );
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open shader file \"");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

bool Shader::loadFromFile(const std::string& filename, Type type)
{
    // Read the file
    std::vector<char> shader;
    if (!getFileContents(filename, shader))
    {
        err() << "Failed to open shader file \"" << filename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    if (type == Vertex)
        return compile(&shader[0], NULL, NULL);
    else if (type == Geometry)
        return compile(NULL, &shader[0], NULL);
    else
        return compile(NULL, NULL, &shader[0]);
}